

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

Result ONX_ModelTest::WorstResult(Result a,Result b)

{
  Result local_c;
  Result local_9;
  Result b_local;
  Result a_local;
  
  if (((a != Unset) || (local_9 = b, b == Unset)) && ((a == Unset || (local_9 = a, b != Unset)))) {
    local_c = b;
    if (a < b) {
      local_c = a;
    }
    local_9 = local_c;
  }
  return local_9;
}

Assistant:

ONX_ModelTest::Result ONX_ModelTest::WorstResult(
  ONX_ModelTest::Result a,
  ONX_ModelTest::Result b
)
{
  if (ONX_ModelTest::Result::Unset == a && ONX_ModelTest::Result::Unset != b)
    return b;
  if (ONX_ModelTest::Result::Unset != a && ONX_ModelTest::Result::Unset == b)
    return a;
  return
    (static_cast<unsigned char>(a) < static_cast<unsigned char>(b))
    ? a : b;
}